

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

QDBusCustomTypeInfo * __thiscall
QHash<int,_QDBusCustomTypeInfo>::operator[](QHash<int,_QDBusCustomTypeInfo> *this,int *key)

{
  QDBusCustomTypeInfo *pQVar1;
  long in_FS_OFFSET;
  int *in_stack_ffffffffffffffb8;
  QHash<int,_QDBusCustomTypeInfo> local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  tryEmplace<>(local_20,in_stack_ffffffffffffffb8);
  pQVar1 = iterator::operator*((iterator *)0x1d0573);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        return *tryEmplace(key).iterator;
    }